

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

void Acb_NtkSaveSupport(Acb_Ntk_t *p,int iObj)

{
  int *piVar1;
  long lVar2;
  
  (p->vSuppOld).nSize = 0;
  piVar1 = Acb_ObjFanins(p,iObj);
  for (lVar2 = 0; lVar2 < *piVar1; lVar2 = lVar2 + 1) {
    Vec_IntPush(&p->vSuppOld,piVar1[lVar2 + 1]);
  }
  return;
}

Assistant:

void Acb_NtkSaveSupport( Acb_Ntk_t * p, int iObj )
{
    int k, iFanin, * pFanins; 
    Vec_IntClear( &p->vSuppOld );
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
        Vec_IntPush( &p->vSuppOld, iFanin );
}